

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::updateMonthMenuNames(QCalendarWidgetPrivate *this)

{
  FormatType FVar1;
  QWidget *this_00;
  QCalendarModel *pQVar2;
  bool bVar3;
  QAction **ppQVar4;
  long in_FS_OFFSET;
  QLocale local_60;
  QLocale local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  FormatType local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_3c = ShortFormat;
  do {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this->m_model;
    QWidget::locale(&local_60,this_00);
    QCalendar::standaloneMonthName(&local_58,(int)pQVar2 + 0x18,(int)&local_60,local_3c);
    QLocale::~QLocale(&local_60);
    ppQVar4 = QMap<int,_QAction_*>::operator[](&this->monthToAction,(int *)&local_3c);
    QAction::setText((QString *)*ppQVar4);
    if (local_58 != (QLocale)0x0) {
      LOCK();
      *(int *)local_58 = *(int *)local_58 + -1;
      UNLOCK();
      if (*(int *)local_58 == 0) {
        QArrayData::deallocate((QArrayData *)local_58,2,0x10);
      }
    }
    FVar1 = local_3c + ShortFormat;
    bVar3 = (int)local_3c < 0xc;
    local_3c = FVar1;
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateMonthMenuNames()
{
    Q_Q(QCalendarWidget);

    for (int i = 1; i <= 12; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        monthToAction[i]->setText(monthName);
    }
}